

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<float,_4,_1,_0,_4,_1> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>>::
_set_noalias<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
          (PlainObjectBase<Eigen::Matrix<float,4,1,0,4,1>> *this,
          DenseBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *other)

{
  Matrix<float,_4,_1,_0,_4,_1> *pMVar1;
  Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *src;
  assign_op<float,_float> local_19;
  EigenBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *local_18;
  DenseBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *other_local;
  PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *this_local;
  
  local_18 = (EigenBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *)other;
  other_local = (DenseBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_> *)this;
  pMVar1 = EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)this);
  src = EigenBase<Eigen::Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>_>::derived(local_18);
  internal::assign_op<float,_float>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>,Eigen::internal::assign_op<float,float>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>::derived
                     ((EigenBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }